

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

void yaml_parser_delete(yaml_parser_t *parser)

{
  yaml_token_t *token;
  yaml_tag_directive_t *pyVar1;
  yaml_char_t *ptr;
  yaml_tag_directive_t tag_directive;
  yaml_parser_t *parser_local;
  
  if (parser != (yaml_parser_t *)0x0) {
    yaml_free((parser->raw_buffer).start);
    (parser->raw_buffer).end = (uchar *)0x0;
    (parser->raw_buffer).pointer = (uchar *)0x0;
    (parser->raw_buffer).start = (uchar *)0x0;
    yaml_free((parser->buffer).start);
    (parser->buffer).end = (yaml_char_t *)0x0;
    (parser->buffer).pointer = (yaml_char_t *)0x0;
    (parser->buffer).start = (yaml_char_t *)0x0;
    while ((parser->tokens).head != (parser->tokens).tail) {
      token = (parser->tokens).head;
      (parser->tokens).head = token + 1;
      yaml_token_delete(token);
    }
    yaml_free((parser->tokens).start);
    (parser->tokens).end = (yaml_token_t *)0x0;
    (parser->tokens).tail = (yaml_token_t *)0x0;
    (parser->tokens).head = (yaml_token_t *)0x0;
    (parser->tokens).start = (yaml_token_t *)0x0;
    yaml_free((parser->indents).start);
    (parser->indents).end = (int *)0x0;
    (parser->indents).top = (int *)0x0;
    (parser->indents).start = (int *)0x0;
    yaml_free((parser->simple_keys).start);
    (parser->simple_keys).end = (yaml_simple_key_t *)0x0;
    (parser->simple_keys).top = (yaml_simple_key_t *)0x0;
    (parser->simple_keys).start = (yaml_simple_key_t *)0x0;
    yaml_free((parser->states).start);
    (parser->states).end = (yaml_parser_state_t *)0x0;
    (parser->states).top = (yaml_parser_state_t *)0x0;
    (parser->states).start = (yaml_parser_state_t *)0x0;
    yaml_free((parser->marks).start);
    (parser->marks).end = (yaml_mark_t *)0x0;
    (parser->marks).top = (yaml_mark_t *)0x0;
    (parser->marks).start = (yaml_mark_t *)0x0;
    while ((parser->tag_directives).start != (parser->tag_directives).top) {
      pyVar1 = (parser->tag_directives).top;
      (parser->tag_directives).top = pyVar1 + -1;
      ptr = pyVar1[-1].prefix;
      yaml_free(pyVar1[-1].handle);
      yaml_free(ptr);
    }
    yaml_free((parser->tag_directives).start);
    (parser->tag_directives).end = (yaml_tag_directive_t *)0x0;
    (parser->tag_directives).top = (yaml_tag_directive_t *)0x0;
    (parser->tag_directives).start = (yaml_tag_directive_t *)0x0;
    memset(parser,0,0x1e0);
    return;
  }
  __assert_fail("parser",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                ,0xde,"void yaml_parser_delete(yaml_parser_t *)");
}

Assistant:

YAML_DECLARE(void)
yaml_parser_delete(yaml_parser_t *parser)
{
    assert(parser); /* Non-NULL parser object expected. */

    BUFFER_DEL(parser, parser->raw_buffer);
    BUFFER_DEL(parser, parser->buffer);
    while (!QUEUE_EMPTY(parser, parser->tokens)) {
        yaml_token_delete(&DEQUEUE(parser, parser->tokens));
    }
    QUEUE_DEL(parser, parser->tokens);
    STACK_DEL(parser, parser->indents);
    STACK_DEL(parser, parser->simple_keys);
    STACK_DEL(parser, parser->states);
    STACK_DEL(parser, parser->marks);
    while (!STACK_EMPTY(parser, parser->tag_directives)) {
        yaml_tag_directive_t tag_directive = POP(parser, parser->tag_directives);
        yaml_free(tag_directive.handle);
        yaml_free(tag_directive.prefix);
    }
    STACK_DEL(parser, parser->tag_directives);

    memset(parser, 0, sizeof(yaml_parser_t));
}